

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  char local_23 [8];
  char w;
  char n;
  char s;
  char eme [8];
  char **argv_local;
  int argc_local;
  
  stack0xffffffffffffffe0 = 0x6d37333b315b1b;
  eme = (char  [8])argv;
  std::operator<<((ostream *)&std::cout,local_23 + 3);
  local_23[2] = 0x73;
  local_23[1] = 0x6e;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Voce acredita que o humano nasce da alteridade(s/n)?");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_23);
  if (local_23[0] == 's') {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
    std::operator<<((ostream *)&std::cout,
                    "o comeco do filosofar, o fundamento da razao, o sentido\n");
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
  }
  else if (local_23[0] == 'n') {
    std::operator<<((ostream *)&std::cout,"Voce precisa estudar o grande filosofo judeu lituano\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"Emanuel Levinas!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Opcao invalida.Tente outra vez\n");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    const char s = 's';
    const char n = 'n';
    char w;

    cout << "Voce acredita que o humano nasce da alteridade(s/n)?" << endl;
    cin >> w;

    if (w == s)
    {
        cout << "SIM!Para o grande filósofo Emanuel Levinas, a ALTERIDADE,\n";
        cout << "o comeco do filosofar, o fundamento da razao, o sentido\n";
        cout << "do humano eh a possibilidade de realização da justica e paz!!\n";
    }
    else if (w == n)
    {
        cout << "Voce precisa estudar o grande filosofo judeu lituano\n";
        cout << "Emanuel Levinas!" << endl;
    }
    else
    {
        cout << "Opcao invalida.Tente outra vez\n";
    }

    return 0;
}